

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

int png_image_write_main(png_voidp argument)

{
  long lVar1;
  ushort uVar2;
  char cVar3;
  uint uVar4;
  png_imagep image_in;
  png_structrp png_ptr;
  png_inforp info_ptr;
  long *plVar5;
  png_byte pVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  size_t size;
  png_voidp ptr;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  png_byte *ppVar15;
  png_uint_32 pVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  code *function;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  png_const_bytep row;
  uint uVar27;
  bool bVar28;
  int local_50c;
  uint local_504;
  long local_4d0;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  png_byte local_438 [256];
  png_color palette [256];
  
  image_in = *argument;
  png_ptr = image_in->opaque->png_ptr;
  uVar4 = image_in->format;
  if ((uVar4 & 0xc) == 4) {
    local_504 = (uint)(*(int *)((long)argument + 0x20) == 0);
  }
  else {
    local_504 = 0;
  }
  info_ptr = image_in->opaque->info_ptr;
  png_set_benign_errors(png_ptr,0);
  pVar16 = image_in->width;
  uVar19 = (ulong)((image_in->format & 3) + 1);
  if ((image_in->format & 8) != 0) {
    uVar19 = 1;
  }
  if ((uint)(0x7fffffff / uVar19) < pVar16) {
    png_error(image_in->opaque->png_ptr,"image row stride too large");
  }
  uVar18 = (int)uVar19 * pVar16;
  uVar14 = *(uint *)((long)argument + 0x10);
  if (*(uint *)((long)argument + 0x10) == 0) {
    *(uint *)((long)argument + 0x10) = uVar18;
    uVar14 = uVar18;
  }
  uVar7 = -uVar14;
  if (0 < (int)uVar14) {
    uVar7 = uVar14;
  }
  if (uVar18 <= uVar7) {
    uVar14 = image_in->height;
    if ((int)((ulong)uVar18 * (ulong)uVar14 >> 0x20) != 0) {
      png_error(image_in->opaque->png_ptr,"memory image too large");
    }
    cVar3 = (char)local_504;
    if ((uVar4 & 8) == 0) {
      png_set_IHDR(png_ptr,info_ptr,pVar16,uVar14,local_504 * 8 + 8,
                   (uint)((byte)(((byte)uVar4 & 2) << 5 | (byte)uVar4 << 7) >> 5),0,0,0);
    }
    else {
      if ((*(long *)((long)argument + 0x18) == 0) ||
         (uVar18 = image_in->colormap_entries, uVar18 == 0)) {
        png_error(image_in->opaque->png_ptr,"no color-map for color-mapped image");
      }
      if (uVar18 < 0x11) {
        if (uVar18 < 5) {
          iVar8 = 2 - (uint)(uVar18 < 3);
        }
        else {
          iVar8 = 4;
        }
      }
      else {
        iVar8 = 8;
      }
      png_set_IHDR(png_ptr,info_ptr,pVar16,uVar14,iVar8,3,0,0,0);
      plVar5 = *argument;
      lVar9 = *(long *)((long)argument + 0x18);
      uVar14 = *(uint *)((long)plVar5 + 0x14);
      uVar18 = 0x100;
      if (*(uint *)((long)plVar5 + 0x1c) < 0x100) {
        uVar18 = *(uint *)((long)plVar5 + 0x1c);
      }
      uVar27 = uVar14 & 3;
      lVar12 = (ulong)uVar27 + 1;
      uVar13 = uVar14 >> 3 & 2;
      memset(local_438,0xff,0x100);
      memset(palette,0,0x300);
      uVar19 = 0;
      bVar28 = (uVar14 & 0x21) == 0x21;
      uVar22 = (ulong)bVar28;
      uVar7 = uVar27;
      if (bVar28) {
        uVar7 = 0;
      }
      uVar24 = uVar13 + bVar28;
      uVar25 = (ulong)uVar24;
      uVar21 = (ulong)(uVar24 ^ 2);
      lVar11 = uVar22 + 1;
      uVar10 = (ulong)(bVar28 ^ 1);
      lVar17 = (ulong)!bVar28 * 3;
      ppVar15 = &palette[0].blue;
      uVar26 = (ulong)(uVar14 >> 2 & 4);
      lVar1 = (ulong)uVar27 * 2 + 2;
      uVar20 = (ulong)((uVar13 ^ 2) * 2);
      local_470 = (ulong)(uVar24 * 2);
      local_478 = (ulong)(uint)((int)lVar11 * 2);
      local_480 = (ulong)((uVar24 ^ 2) * 2);
      local_488 = (ulong)((uint)bVar28 * 2);
      uVar23 = (ulong)(uVar7 * 2);
      local_4d0 = 2;
      local_50c = 0;
      for (; uVar18 != uVar19; uVar19 = uVar19 + 1) {
        iVar8 = (int)uVar19;
        if ((uVar14 & 4) == 0) {
          switch(uVar27) {
          case 1:
            pVar6 = *(png_byte *)(lVar9 + uVar10);
            local_438[uVar19] = pVar6;
            if (pVar6 != 0xff) {
              local_50c = iVar8 + 1;
            }
          case 0:
            pVar6 = *(png_byte *)(lVar9 + uVar22);
            ppVar15[-1] = pVar6;
            ((png_color *)(ppVar15 + -2))->red = pVar6;
            *ppVar15 = pVar6;
            break;
          case 3:
            pVar6 = *(png_byte *)(lVar9 + lVar17);
            local_438[uVar19] = pVar6;
            if (pVar6 != 0xff) {
              local_50c = iVar8 + 1;
            }
          case 2:
            *ppVar15 = *(png_byte *)(lVar9 + uVar21);
            ppVar15[-1] = *(png_byte *)(lVar9 + lVar11);
            ((png_color *)(ppVar15 + -2))->red = *(png_byte *)(lVar9 + uVar25);
          }
        }
        else if ((uVar14 & 1) == 0) {
          if (uVar27 < 2) {
            uVar7 = (uint)*(ushort *)(lVar9 + -2 + local_4d0) * 0xff;
            uVar13 = uVar7 >> 0xf;
            pVar6 = (png_byte)
                    (((uint)png_sRGB_delta[uVar13] * (uVar7 & 0x7fff) >> 0xc) +
                     (uint)png_sRGB_base[uVar13] >> 8);
            ppVar15[-1] = pVar6;
            ((png_color *)(ppVar15 + -2))->red = pVar6;
            *ppVar15 = pVar6;
          }
          else {
            uVar7 = (uint)*(ushort *)(lVar9 + uVar20) * 0xff;
            uVar13 = uVar7 >> 0xf;
            *ppVar15 = (png_byte)
                       (((uint)png_sRGB_delta[uVar13] * (uVar7 & 0x7fff) >> 0xc) +
                        (uint)png_sRGB_base[uVar13] >> 8);
            uVar7 = (uint)*(ushort *)(lVar9 + local_4d0) * 0xff;
            uVar13 = uVar7 >> 0xf;
            ppVar15[-1] = (png_byte)
                          (((uint)png_sRGB_delta[uVar13] * (uVar7 & 0x7fff) >> 0xc) +
                           (uint)png_sRGB_base[uVar13] >> 8);
            uVar7 = (uint)*(ushort *)(lVar9 + uVar26) * 0xff;
            uVar13 = uVar7 >> 0xf;
            ((png_color *)(ppVar15 + -2))->red =
                 (png_byte)
                 (((uint)png_sRGB_delta[uVar13] * (uVar7 & 0x7fff) >> 0xc) +
                  (uint)png_sRGB_base[uVar13] >> 8);
          }
        }
        else {
          uVar2 = *(ushort *)(lVar9 + uVar23);
          uVar7 = (uint)uVar2 * 0xff + 0x807f;
          pVar16 = 0;
          uVar13 = uVar7 >> 0x10;
          if ((uVar13 != 0) && (uVar13 != 0xff)) {
            pVar16 = ((uVar2 >> 1) + 0x7f7f8080) / (uint)uVar2;
          }
          if (uVar13 != 0xff) {
            local_50c = iVar8 + 1;
          }
          local_438[uVar19] = (png_byte)(uVar7 >> 0x10);
          if (uVar27 < 2) {
            pVar6 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_488),(uint)uVar2,pVar16);
            ppVar15[-1] = pVar6;
            ((png_color *)(ppVar15 + -2))->red = pVar6;
            *ppVar15 = pVar6;
          }
          else {
            pVar6 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_480),(uint)uVar2,pVar16);
            *ppVar15 = pVar6;
            pVar6 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_478),(uint)uVar2,pVar16);
            ppVar15[-1] = pVar6;
            pVar6 = png_unpremultiply((uint)*(ushort *)(lVar9 + local_470),(uint)uVar2,pVar16);
            ((png_color *)(ppVar15 + -2))->red = pVar6;
          }
        }
        ppVar15 = ppVar15 + 3;
        lVar17 = lVar17 + lVar12;
        uVar25 = uVar25 + lVar12;
        lVar11 = lVar11 + lVar12;
        uVar21 = uVar21 + lVar12;
        uVar10 = uVar10 + lVar12;
        uVar22 = uVar22 + lVar12;
        uVar26 = uVar26 + lVar1;
        local_4d0 = local_4d0 + lVar1;
        uVar20 = uVar20 + lVar1;
        local_470 = local_470 + lVar1;
        local_478 = local_478 + lVar1;
        local_480 = local_480 + lVar1;
        local_488 = local_488 + lVar1;
        uVar23 = uVar23 + lVar1;
      }
      png_set_PLTE(*(png_structrp *)*plVar5,(png_inforp)((undefined8 *)*plVar5)[1],palette,uVar18);
      if (0 < local_50c) {
        png_set_tRNS(*(png_structrp *)*plVar5,(png_inforp)((undefined8 *)*plVar5)[1],local_438,
                     local_50c,(png_const_color_16p)0x0);
      }
      *(uint *)((long)plVar5 + 0x1c) = uVar18;
    }
    if (cVar3 == '\0') {
      if ((image_in->flags & 1) == 0) {
        png_set_sRGB(png_ptr,info_ptr,0);
      }
      else {
        png_set_gAMA_fixed(png_ptr,info_ptr,0xb18f);
      }
    }
    else {
      png_set_gAMA_fixed(png_ptr,info_ptr,100000);
      if ((image_in->flags & 1) == 0) {
        png_set_cHRM_fixed(png_ptr,info_ptr,0x7a26,0x8084,64000,33000,30000,60000,15000,6000);
      }
    }
    png_write_info(png_ptr,info_ptr);
    if (cVar3 != '\0') {
      png_set_swap(png_ptr);
    }
    uVar14 = uVar4;
    if ((uVar4 & 0x10) != 0) {
      if ((uVar4 & 10) == 2) {
        png_set_bgr(png_ptr);
      }
      uVar14 = uVar4 & 0xffffffef;
    }
    if ((uVar14 & 0x20) != 0) {
      if ((uVar14 & 1) != 0 && (char)((uVar4 & 8) >> 3) == '\0') {
        png_set_swap_alpha(png_ptr);
      }
      uVar14 = uVar14 & 0xffffffdf;
    }
    if (((uVar4 & 8) != 0) && (image_in->colormap_entries < 0x11)) {
      png_set_packing(png_ptr);
    }
    if (uVar14 < 0x10) {
      lVar9 = *(long *)((long)argument + 8);
      lVar12 = (long)*(int *)((long)argument + 0x10) << ((uVar4 & 0xc) == 4);
      if ((long)*(int *)((long)argument + 0x10) < 0) {
        lVar9 = lVar9 - (ulong)(image_in->height - 1) * lVar12;
      }
      *(long *)((long)argument + 0x28) = lVar9;
      *(long *)((long)argument + 0x30) = lVar12;
      if (((image_in->flags & 2) != 0) &&
         (png_set_filter(png_ptr,0,0), png_ptr != (png_structrp)0x0)) {
        png_ptr->zlib_level = 3;
      }
      if (((uVar4 & 0xd) == 5) || (((uVar4 & 8) == 0 && (*(int *)((long)argument + 0x20) != 0)))) {
        size = png_get_rowbytes(png_ptr,info_ptr);
        ptr = png_malloc(png_ptr,size);
        *(png_voidp *)((long)argument + 0x38) = ptr;
        function = png_write_image_8bit;
        if (cVar3 != '\0') {
          function = png_write_image_16bit;
        }
        iVar8 = png_safe_execute(image_in,function,argument);
        *(undefined8 *)((long)argument + 0x38) = 0;
        png_free(png_ptr,ptr);
        if (iVar8 == 0) {
          return 0;
        }
      }
      else {
        row = *(png_const_bytep *)((long)argument + 0x28);
        lVar9 = *(long *)((long)argument + 0x30);
        pVar16 = image_in->height;
        while (bVar28 = pVar16 != 0, pVar16 = pVar16 - 1, bVar28) {
          png_write_row(png_ptr,row);
          row = row + lVar9;
        }
      }
      png_write_end(png_ptr,info_ptr);
      return 1;
    }
    png_error(png_ptr,"png_write_image: unsupported transformation");
  }
  png_error(image_in->opaque->png_ptr,"supplied row stride too small");
}

Assistant:

static int
png_image_write_main(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   png_inforp info_ptr = image->opaque->info_ptr;
   png_uint_32 format = image->format;

   /* The following four ints are actually booleans */
   int colormap = (format & PNG_FORMAT_FLAG_COLORMAP);
   int linear = !colormap && (format & PNG_FORMAT_FLAG_LINEAR); /* input */
   int alpha = !colormap && (format & PNG_FORMAT_FLAG_ALPHA);
   int write_16bit = linear && (display->convert_to_8bit == 0);

#   ifdef PNG_BENIGN_ERRORS_SUPPORTED
      /* Make sure we error out on any bad situation */
      png_set_benign_errors(png_ptr, 0/*error*/);
#   endif

   /* Default the 'row_stride' parameter if required, also check the row stride
    * and total image size to ensure that they are within the system limits.
    */
   {
      unsigned int channels = PNG_IMAGE_PIXEL_CHANNELS(image->format);

      if (image->width <= 0x7fffffffU/channels) /* no overflow */
      {
         png_uint_32 check;
         png_uint_32 png_row_stride = image->width * channels;

         if (display->row_stride == 0)
            display->row_stride = (png_int_32)/*SAFE*/png_row_stride;

         if (display->row_stride < 0)
            check = (png_uint_32)(-display->row_stride);

         else
            check = (png_uint_32)display->row_stride;

         if (check >= png_row_stride)
         {
            /* Now check for overflow of the image buffer calculation; this
             * limits the whole image size to 32 bits for API compatibility with
             * the current, 32-bit, PNG_IMAGE_BUFFER_SIZE macro.
             */
            if (image->height > 0xffffffffU/png_row_stride)
               png_error(image->opaque->png_ptr, "memory image too large");
         }

         else
            png_error(image->opaque->png_ptr, "supplied row stride too small");
      }

      else
         png_error(image->opaque->png_ptr, "image row stride too large");
   }

   /* Set the required transforms then write the rows in the correct order. */
   if ((format & PNG_FORMAT_FLAG_COLORMAP) != 0)
   {
      if (display->colormap != NULL && image->colormap_entries > 0)
      {
         png_uint_32 entries = image->colormap_entries;

         png_set_IHDR(png_ptr, info_ptr, image->width, image->height,
             entries > 16 ? 8 : (entries > 4 ? 4 : (entries > 2 ? 2 : 1)),
             PNG_COLOR_TYPE_PALETTE, PNG_INTERLACE_NONE,
             PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

         png_image_set_PLTE(display);
      }

      else
         png_error(image->opaque->png_ptr,
             "no color-map for color-mapped image");
   }

   else
      png_set_IHDR(png_ptr, info_ptr, image->width, image->height,
          write_16bit ? 16 : 8,
          ((format & PNG_FORMAT_FLAG_COLOR) ? PNG_COLOR_MASK_COLOR : 0) +
          ((format & PNG_FORMAT_FLAG_ALPHA) ? PNG_COLOR_MASK_ALPHA : 0),
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

   /* Counter-intuitively the data transformations must be called *after*
    * png_write_info, not before as in the read code, but the 'set' functions
    * must still be called before.  Just set the color space information, never
    * write an interlaced image.
    */

   if (write_16bit != 0)
   {
      /* The gamma here is 1.0 (linear) and the cHRM chunk matches sRGB. */
      png_set_gAMA_fixed(png_ptr, info_ptr, PNG_GAMMA_LINEAR);

      if ((image->flags & PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB) == 0)
         png_set_cHRM_fixed(png_ptr, info_ptr,
             /* color      x       y */
             /* white */ 31270, 32900,
             /* red   */ 64000, 33000,
             /* green */ 30000, 60000,
             /* blue  */ 15000,  6000
         );
   }

   else if ((image->flags & PNG_IMAGE_FLAG_COLORSPACE_NOT_sRGB) == 0)
      png_set_sRGB(png_ptr, info_ptr, PNG_sRGB_INTENT_PERCEPTUAL);

   /* Else writing an 8-bit file and the *colors* aren't sRGB, but the 8-bit
    * space must still be gamma encoded.
    */
   else
      png_set_gAMA_fixed(png_ptr, info_ptr, PNG_GAMMA_sRGB_INVERSE);

   /* Write the file header. */
   png_write_info(png_ptr, info_ptr);

   /* Now set up the data transformations (*after* the header is written),
    * remove the handled transformations from the 'format' flags for checking.
    *
    * First check for a little endian system if writing 16-bit files.
    */
   if (write_16bit != 0)
   {
      png_uint_16 le = 0x0001;

      if ((*(png_const_bytep) & le) != 0)
         png_set_swap(png_ptr);
   }

#   ifdef PNG_SIMPLIFIED_WRITE_BGR_SUPPORTED
      if ((format & PNG_FORMAT_FLAG_BGR) != 0)
      {
         if (colormap == 0 && (format & PNG_FORMAT_FLAG_COLOR) != 0)
            png_set_bgr(png_ptr);
         format &= ~PNG_FORMAT_FLAG_BGR;
      }
#   endif

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         if (colormap == 0 && (format & PNG_FORMAT_FLAG_ALPHA) != 0)
            png_set_swap_alpha(png_ptr);
         format &= ~PNG_FORMAT_FLAG_AFIRST;
      }
#   endif

   /* If there are 16 or fewer color-map entries we wrote a lower bit depth
    * above, but the application data is still byte packed.
    */
   if (colormap != 0 && image->colormap_entries <= 16)
      png_set_packing(png_ptr);

   /* That should have handled all (both) the transforms. */
   if ((format & ~(png_uint_32)(PNG_FORMAT_FLAG_COLOR | PNG_FORMAT_FLAG_LINEAR |
         PNG_FORMAT_FLAG_ALPHA | PNG_FORMAT_FLAG_COLORMAP)) != 0)
      png_error(png_ptr, "png_write_image: unsupported transformation");

   {
      png_const_bytep row = png_voidcast(png_const_bytep, display->buffer);
      ptrdiff_t row_bytes = display->row_stride;

      if (linear != 0)
         row_bytes *= (sizeof (png_uint_16));

      if (row_bytes < 0)
         row += (image->height-1) * (-row_bytes);

      display->first_row = row;
      display->row_bytes = row_bytes;
   }

   /* Apply 'fast' options if the flag is set. */
   if ((image->flags & PNG_IMAGE_FLAG_FAST) != 0)
   {
      png_set_filter(png_ptr, PNG_FILTER_TYPE_BASE, PNG_NO_FILTERS);
      /* NOTE: determined by experiment using pngstest, this reflects some
       * balance between the time to write the image once and the time to read
       * it about 50 times.  The speed-up in pngstest was about 10-20% of the
       * total (user) time on a heavily loaded system.
       */
#   ifdef PNG_WRITE_CUSTOMIZE_COMPRESSION_SUPPORTED
      png_set_compression_level(png_ptr, 3);
#   endif
   }

   /* Check for the cases that currently require a pre-transform on the row
    * before it is written.  This only applies when the input is 16-bit and
    * either there is an alpha channel or it is converted to 8-bit.
    */
   if ((linear != 0 && alpha != 0 ) ||
       (colormap == 0 && display->convert_to_8bit != 0))
   {
      png_bytep row = png_voidcast(png_bytep, png_malloc(png_ptr,
          png_get_rowbytes(png_ptr, info_ptr)));
      int result;

      display->local_row = row;
      if (write_16bit != 0)
         result = png_safe_execute(image, png_write_image_16bit, display);
      else
         result = png_safe_execute(image, png_write_image_8bit, display);
      display->local_row = NULL;

      png_free(png_ptr, row);

      /* Skip the 'write_end' on error: */
      if (result == 0)
         return 0;
   }

   /* Otherwise this is the case where the input is in a format currently
    * supported by the rest of the libpng write code; call it directly.
    */
   else
   {
      png_const_bytep row = png_voidcast(png_const_bytep, display->first_row);
      ptrdiff_t row_bytes = display->row_bytes;
      png_uint_32 y = image->height;

      for (; y > 0; --y)
      {
         png_write_row(png_ptr, row);
         row += row_bytes;
      }
   }

   png_write_end(png_ptr, info_ptr);
   return 1;
}